

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O0

void __thiscall IndexManager::CreateIndexFile(IndexManager *this,IndexInfo *I)

{
  ostream *this_00;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_BpTree<int>_>_>::value,_pair<iterator,_bool>_>
  _Var1;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_BpTree<float>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_318 [32];
  undefined1 local_2f8 [8];
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> Tree_S;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
  local_298;
  string local_228 [32];
  undefined1 local_208 [8];
  BpTree<float> Tree_F;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
  local_1a8;
  string local_138 [32];
  undefined1 local_118 [8];
  BpTree<int> Tree_I;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [48];
  string local_38 [8];
  string filename;
  IndexInfo *I_local;
  IndexManager *this_local;
  
  std::__cxx11::string::string(local_38);
  this_00 = std::operator<<((ostream *)&std::cout,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Tree_I.RootAddr,&this->Direction);
  std::operator+(local_a8,(char *)&Tree_I.RootAddr);
  std::operator+(local_88,local_a8);
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::string::operator=(local_38,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&Tree_I.RootAddr);
  std::operator<<((ostream *)&std::cout,local_38);
  if (I->type == 50000) {
    std::__cxx11::string::string(local_138,local_38);
    BpTree<int>::BpTree((BpTree<int> *)local_118,(string *)local_138,'0');
    std::__cxx11::string::~string(local_138);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<int>_&,_true>
              (&local_1a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (BpTree<int> *)local_118);
    _Var1 = std::
            map<std::__cxx11::string,BpTree<int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
            ::insert<std::pair<std::__cxx11::string,BpTree<int>>>
                      ((map<std::__cxx11::string,BpTree<int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
                        *)&this->BpTrees_I,&local_1a8);
    Tree_F.RootAddr = (Addr)_Var1.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
    ::~pair(&local_1a8);
    BpTree<int>::~BpTree((BpTree<int> *)local_118);
  }
  else if (I->type == 90000) {
    std::__cxx11::string::string(local_228,local_38);
    BpTree<float>::BpTree((BpTree<float> *)local_208,(string *)local_228,'1');
    std::__cxx11::string::~string(local_228);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<float>_&,_true>
              (&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (BpTree<float> *)local_208);
    _Var2 = std::
            map<std::__cxx11::string,BpTree<float>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
            ::insert<std::pair<std::__cxx11::string,BpTree<float>>>
                      ((map<std::__cxx11::string,BpTree<float>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
                        *)&this->BpTrees_F,&local_298);
    Tree_S.RootAddr = (Addr)_Var2.first._M_node;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
    ::~pair(&local_298);
    BpTree<float>::~BpTree((BpTree<float> *)local_208);
  }
  else if (120000 < I->type) {
    std::__cxx11::string::string(local_318,local_38);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BpTree
              ((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2f8,(string *)local_318,'2');
    std::__cxx11::string::~string(local_318);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
              (&local_388,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2f8);
    std::
    map<std::__cxx11::string,BpTree<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
    ::insert<std::pair<std::__cxx11::string,BpTree<std::__cxx11::string>>>
              ((map<std::__cxx11::string,BpTree<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
                *)&this->BpTrees_S,&local_388);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~pair(&local_388);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~BpTree((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_2f8);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void IndexManager::CreateIndexFile(IndexInfo I) {
	string filename;
	cout<<"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx"<<endl;
	filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	cout<<filename;
	if (I.type == 50000) {
		BpTree<int> Tree_I = BpTree<int>(filename, INT);
		this->BpTrees_I.insert(pair<string, BpTree<int> > (filename, Tree_I));
	}
	else if (I.type == 90000) {
		BpTree<float> Tree_F = BpTree<float>(filename, FLOAT);
		this->BpTrees_F.insert(pair<string, BpTree<float> >(filename, Tree_F));
	}
	else if (I.type > 120000) {
		BpTree<string> Tree_S = BpTree<string>(filename, STRING);
		this->BpTrees_S.insert(pair<string, BpTree<string> >(filename, Tree_S));
	}
}